

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O1

int __thiscall
glcts::DrawElementsBaseVertexNegativeActiveTransformFeedbackTest::init
          (DrawElementsBaseVertexNegativeActiveTransformFeedbackTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  long lVar3;
  
  DrawElementsBaseVertexTestBase::init(&this->super_DrawElementsBaseVertexTestBase,ctx);
  iVar1 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_bo_tf_result_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                  ,0x9d9);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo_tf_result_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                  ,0x9dc);
  (**(code **)(lVar3 + 0x150))(0x8892,0x30,0,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                  ,0x9e1);
  (**(code **)(lVar3 + 0x48))(0x8c8e,0,this->m_bo_tf_result_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                  ,0x9e5);
  return extraout_EAX;
}

Assistant:

void DrawElementsBaseVertexNegativeActiveTransformFeedbackTest::init()
{
	/* Call the base class' init() first. */
	DrawElementsBaseVertexTestBase::init();

	/* Proceed with internal initialization */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genBuffers(1, &m_bo_tf_result_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_tf_result_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	gl.bufferData(GL_ARRAY_BUFFER, 3 /* count */ * sizeof(float) * 4 /* components used by gl_Position */,
				  DE_NULL, /* data */
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_tf_result_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");
}